

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O2

void Saig_ManWindowInsertBig_rec
               (Aig_Man_t *pNew,Aig_Obj_t *pObjBig,Vec_Ptr_t *vBigNode2SmallPo,
               Vec_Ptr_t *vSmallPi2BigNode)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *p1;
  
  if ((pObjBig->field_5).pData == (void *)0x0) {
    pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(vBigNode2SmallPo,pObjBig->Id);
    if (pAVar1 == (Aig_Obj_t *)0x0) {
      if ((*(uint *)&pObjBig->field_0x18 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObjBig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                      ,0x130,
                      "void Saig_ManWindowInsertBig_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      Saig_ManWindowInsertBig_rec
                (pNew,(Aig_Obj_t *)((ulong)pObjBig->pFanin0 & 0xfffffffffffffffe),vBigNode2SmallPo,
                 vSmallPi2BigNode);
      Saig_ManWindowInsertBig_rec
                (pNew,(Aig_Obj_t *)((ulong)pObjBig->pFanin1 & 0xfffffffffffffffe),vBigNode2SmallPo,
                 vSmallPi2BigNode);
      pAVar1 = Aig_ObjChild0Copy(pObjBig);
      p1 = Aig_ObjChild1Copy(pObjBig);
      pAVar1 = Aig_And(pNew,pAVar1,p1);
    }
    else {
      Saig_ManWindowInsertSmall_rec
                (pNew,(Aig_Obj_t *)((ulong)pAVar1->pFanin0 & 0xfffffffffffffffe),vBigNode2SmallPo,
                 vSmallPi2BigNode);
      pAVar1 = Aig_ObjChild0Copy(pAVar1);
    }
    (pObjBig->field_5).pData = pAVar1;
  }
  return;
}

Assistant:

void Saig_ManWindowInsertBig_rec( Aig_Man_t * pNew, Aig_Obj_t * pObjBig, 
         Vec_Ptr_t * vBigNode2SmallPo, Vec_Ptr_t * vSmallPi2BigNode )
{
    Aig_Obj_t * pMatch;
    if ( pObjBig->pData )
        return;
    if ( (pMatch = (Aig_Obj_t *)Vec_PtrEntry( vBigNode2SmallPo, pObjBig->Id )) )
    {
        Saig_ManWindowInsertSmall_rec( pNew, Aig_ObjFanin0(pMatch), vBigNode2SmallPo, vSmallPi2BigNode );
        pObjBig->pData = Aig_ObjChild0Copy(pMatch);
        return;        
    }
    assert( Aig_ObjIsNode(pObjBig) );
    Saig_ManWindowInsertBig_rec( pNew, Aig_ObjFanin0(pObjBig), vBigNode2SmallPo, vSmallPi2BigNode );
    Saig_ManWindowInsertBig_rec( pNew, Aig_ObjFanin1(pObjBig), vBigNode2SmallPo, vSmallPi2BigNode );
    pObjBig->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObjBig), Aig_ObjChild1Copy(pObjBig) );
}